

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-schema-to-grammar.cpp
# Opt level: O0

string * __thiscall SchemaConverter::_generate_constant_rule(SchemaConverter *this,json *value)

{
  string *in_RDI;
  string *in_stack_00000028;
  error_handler_t in_stack_0000026c;
  bool in_stack_00000272;
  char in_stack_00000273;
  int in_stack_00000274;
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *in_stack_00000278;
  string local_38 [56];
  
  nlohmann::json_abi_v3_11_3::
  basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::dump(in_stack_00000278,in_stack_00000274,in_stack_00000273,in_stack_00000272,in_stack_0000026c);
  format_literal(in_stack_00000028);
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

std::string _generate_constant_rule(const json & value) {
        return format_literal(value.dump());
    }